

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentSSBOAtomicCounterMixedCase::init
          (ConcurrentSSBOAtomicCounterMixedCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  RenderContext *pRVar2;
  Context *pCVar3;
  int iVar4;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *pSVar6;
  ostream *poVar7;
  ProgramSources *pPVar8;
  TestError *pTVar9;
  ScopedLogSection section;
  Context *local_2e0 [4];
  string local_2c0;
  undefined1 local_2a0 [40];
  deUint32 zeroBuf [2];
  ProgramSources local_270;
  ostringstream buf;
  long lVar5;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  zeroBuf[0] = 0;
  zeroBuf[1] = 0;
  (**(code **)(lVar5 + 0x6c8))(1,&this->m_bufferID);
  (**(code **)(lVar5 + 0x40))(0x90d2,this->m_bufferID);
  (**(code **)(lVar5 + 0x150))(0x90d2,8,zeroBuf,0x88ea);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"gen buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xbc5);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"SSBOProgram",(allocator<char> *)local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"SSBO atomic program",(allocator<char> *)local_2e0);
  pPVar8 = &local_270;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&buf,(string *)pPVar8);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&buf);
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_270,0,0xac);
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_270._193_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "${GLSL_VERSION_DECL}\n");
  poVar7 = std::operator<<(poVar7,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar7 = std::operator<<(poVar7,"layout (binding = 1, std430) volatile buffer WorkBuffer\n");
  poVar7 = std::operator<<(poVar7,"{\n");
  poVar7 = std::operator<<(poVar7,"\thighp uint targetValue;\n");
  poVar7 = std::operator<<(poVar7,"\thighp uint dummy;\n");
  poVar7 = std::operator<<(poVar7,"} sb_work;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"void main ()\n");
  poVar7 = std::operator<<(poVar7,"{\n");
  poVar7 = std::operator<<(poVar7,"\t// flip high bits\n");
  poVar7 = std::operator<<(poVar7,
                           "\thighp uint mask = uint(1) << (24u + (gl_GlobalInvocationID.x % 8u));\n"
                          );
  poVar7 = std::operator<<(poVar7,"\tsb_work.dummy = atomicXor(sb_work.targetValue, mask);\n");
  std::operator<<(poVar7,"}");
  pCVar3 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2c0,(_anonymous_namespace_ *)pCVar3,local_2e0[0],(char *)pPVar8);
  std::__cxx11::string::~string((string *)local_2e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_2a0,&local_2c0);
  pPVar8 = glu::ProgramSources::operator<<(&local_270,(ShaderSource *)local_2a0);
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar2,pPVar8);
  this->m_ssboAtomicProgram = pSVar6;
  std::__cxx11::string::~string((string *)(local_2a0 + 8));
  std::__cxx11::string::~string((string *)&local_2c0);
  glu::ProgramSources::~ProgramSources(&local_270);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_ssboAtomicProgram);
  if ((this->m_ssboAtomicProgram->m_program).m_info.linkOk == false) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"could not build program",(allocator<char> *)&local_270);
    tcu::TestError::TestError(pTVar9,(string *)&buf);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"AtomicCounterProgram",(allocator<char> *)local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Atomic counter program",(allocator<char> *)local_2e0);
  pPVar8 = &local_270;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&buf,(string *)pPVar8);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&buf);
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_270,0,0xac);
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_270.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_270._193_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar7 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "${GLSL_VERSION_DECL}\n");
  poVar7 = std::operator<<(poVar7,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,
                           "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"void main ()\n");
  poVar7 = std::operator<<(poVar7,"{\n");
  poVar7 = std::operator<<(poVar7,"\tatomicCounterIncrement(u_counter);\n");
  std::operator<<(poVar7,"}");
  pCVar3 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2c0,(_anonymous_namespace_ *)pCVar3,local_2e0[0],(char *)pPVar8);
  std::__cxx11::string::~string((string *)local_2e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_2a0,&local_2c0);
  pPVar8 = glu::ProgramSources::operator<<(&local_270,(ShaderSource *)local_2a0);
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar2,pPVar8);
  this->m_atomicCounterProgram = pSVar6;
  std::__cxx11::string::~string((string *)(local_2a0 + 8));
  std::__cxx11::string::~string((string *)&local_2c0);
  glu::ProgramSources::~ProgramSources(&local_270);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_atomicCounterProgram);
  if ((this->m_atomicCounterProgram->m_program).m_info.linkOk != false) {
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    return extraout_EAX;
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"could not build program",(allocator<char> *)&local_270);
  tcu::TestError::TestError(pTVar9,(string *)&buf);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConcurrentSSBOAtomicCounterMixedCase::init (void)
{
	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const deUint32				zeroBuf[2]	= { 0, 0 };

	// gen buffer

	gl.genBuffers(1, &m_bufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_bufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, (int)(sizeof(deUint32) * 2), zeroBuf, GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");

	// gen programs

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "SSBOProgram", "SSBO atomic program");

		m_ssboAtomicProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genSSBOComputeSource()));
		m_testCtx.getLog() << *m_ssboAtomicProgram;
		if (!m_ssboAtomicProgram->isOk())
			throw tcu::TestError("could not build program");
	}
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "AtomicCounterProgram", "Atomic counter program");

		m_atomicCounterProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genAtomicCounterComputeSource()));
		m_testCtx.getLog() << *m_atomicCounterProgram;
		if (!m_atomicCounterProgram->isOk())
			throw tcu::TestError("could not build program");
	}
}